

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

void __thiscall CTcEmbedTokenList::reduce(CTcEmbedTokenList *this,CTcStrTemplate *tpl)

{
  uint uVar1;
  CTcToken *this_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CTcEmbedTokenList *pCVar6;
  CTcTokenEle *src;
  CTcTokenEle *dst;
  bool bVar7;
  
  uVar1 = this->cnt;
  iVar3 = *(int *)(tpl + 0x10);
  iVar4 = uVar1 + 1;
  pCVar6 = this;
  iVar5 = iVar3;
  while ((src = pCVar6->head, src != (CTcTokenEle *)0x0 &&
         (this_00 = *(CTcToken **)tpl, this_00 != (CTcToken *)0x0))) {
    iVar2 = CTcToken::text_matches(this_00,"*",1);
    if (iVar2 != 0) break;
    pCVar6 = (CTcEmbedTokenList *)&src->nxt_;
    iVar5 = iVar5 + -1;
    iVar4 = iVar4 + -1;
    tpl = (CTcStrTemplate *)(this_00 + 1);
  }
  iVar4 = iVar4 - iVar5;
  this->cnt = iVar4;
  dst = this->head;
  if (src != dst) {
    for (iVar3 = ~uVar1 + iVar3; (src != (CTcTokenEle *)0x0 && (iVar3 != 0)); iVar3 = iVar3 + 1) {
      CTcTokenizer::copytok(G_tok,&dst->super_CTcToken,&src->super_CTcToken);
      src = src->nxt_;
      dst = dst->nxt_;
    }
    dst = this->head;
    iVar4 = this->cnt;
  }
  while( true ) {
    this->wrt = dst;
    bVar7 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar7) break;
    dst = dst->nxt_;
  }
  return;
}

Assistant:

void reduce(CTcStrTemplate *tpl)
    {
        /* find the first token in our list matching '*' in the template */
        CTcTokenEle *src, *tele;
        int rem, trem;
        for (src = head, tele = tpl->head, rem = cnt, trem = tpl->cnt ;
             src != 0 && tele != 0 ;
             src = src->getnxt(), tele = tele->getnxt(), --rem, --trem)
        {
            /* stop when we reach '*' in the template */
            if (tele->text_matches("*", 1))
                break;
        }

        /* skip the '*' in the template */
        trem -= 1;

        /* 
         *   The number of tokens matching '*' is the number left in our
         *   list, minus the number left in the token list after the '*'.
         */
        rem -= trem;
        cnt = rem;

        /* if we had any leading fixed tokens to remove, remove them */
        if (src != head)
        {
            CTcTokenEle *dst;
            for (dst = head ; rem != 0 && src != 0 ;
                 src = src->getnxt(), dst = dst->getnxt(), --rem)
            {
                /* copy this token */
                G_tok->copytok(dst, src);
            }
        }

        /* move the write pointer to the proper position */
        for (wrt = head, rem = cnt ; rem != 0 ; wrt = wrt->getnxt(), --rem) ;
    }